

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::save_data
          (section_impl<ELFIO::Elf64_Shdr> *this,ostream *stream,streampos data_offset)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  streamoff offset;
  element_type *peVar4;
  pointer pcVar5;
  undefined4 extraout_var;
  unique_ptr<char[],_std::default_delete<char[]>_> local_40;
  unique_ptr<char[],_std::default_delete<char[]>_> compressed_ptr;
  Elf_Xword compressed_size;
  Elf_Xword decompressed_size;
  ostream *stream_local;
  section_impl<ELFIO::Elf64_Shdr> *this_local;
  streampos data_offset_local;
  
  data_offset_local._M_off = (streamoff)data_offset._M_state;
  this_local = (section_impl<ELFIO::Elf64_Shdr> *)data_offset._M_off;
  offset = std::fpos::operator_cast_to_long((fpos *)&this_local);
  adjust_stream_size(stream,offset);
  uVar2 = (*(this->super_section)._vptr_section[7])();
  if ((((uVar2 & 0x800) == 0) &&
      (uVar2 = (*(this->super_section)._vptr_section[7])(), (uVar2 & 0x8000000) == 0)) ||
     (bVar1 = std::operator!=(&this->compression,(nullptr_t)0x0), !bVar1)) {
    iVar3 = (*(this->super_section)._vptr_section[0x18])();
    (*(this->super_section)._vptr_section[0x13])();
    std::ostream::write((char *)stream,CONCAT44(extraout_var,iVar3));
  }
  else {
    iVar3 = (*(this->super_section)._vptr_section[0x13])();
    compressed_ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
    peVar4 = std::
             __shared_ptr_access<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->compression);
    pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
    (**(code **)(*(long *)peVar4 + 0x18))
              (&local_40,peVar4,pcVar5,this->convertor,iVar3,&compressed_ptr);
    pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_40);
    std::ostream::write((char *)stream,(long)pcVar5);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_40);
  }
  return;
}

Assistant:

void save_data( std::ostream& stream, std::streampos data_offset )
    {
        adjust_stream_size( stream, data_offset );

        if ( ( ( get_flags() & SHF_COMPRESSED ) ||
               ( get_flags() & SHF_RPX_DEFLATE ) ) &&
             compression != nullptr ) {
            Elf_Xword decompressed_size = get_size();
            Elf_Xword compressed_size   = 0;
            auto      compressed_ptr    = compression->deflate(
                data.get(), convertor, decompressed_size, compressed_size );
            stream.write( compressed_ptr.get(), compressed_size );
        }
        else {
            stream.write( get_data(), get_size() );
        }
    }